

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  pointer *this;
  pointer this_00;
  bool bVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_f8 [8];
  cmExecutionStatus status;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  cmListFileFunction lff;
  int local_58;
  int i;
  undefined1 local_48 [8];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> lffArgs;
  cmMakefile *mf;
  char **args_local;
  int numArgs_local;
  char *name_local;
  void *arg_local;
  
  lffArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arg;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_48);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_48,
             (long)numArgs);
  for (local_58 = 0; local_58 < numArgs; local_58 = local_58 + 1) {
    lff.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
    lff.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 0;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)local_48,
               args + local_58,
               (Delimiter *)
               ((long)&lff.Impl.
                       super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 4),
               (int *)&lff.Impl.
                       super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,name,&local_91);
  this = &status.Variables.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this,
             (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_48);
  cmListFileFunction::cmListFileFunction
            ((cmListFileFunction *)local_70,&local_90,0,0,
             (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
             &status.Variables.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  cmExecutionStatus::cmExecutionStatus
            ((cmExecutionStatus *)local_f8,
             (cmMakefile *)
             lffArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = lffArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&local_120);
  bVar1 = cmMakefile::ExecuteCommand
                    ((cmMakefile *)this_00,(cmListFileFunction *)local_70,
                     (cmExecutionStatus *)local_f8,&local_120);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_120);
  cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_f8);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_70);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_48);
  return (uint)bVar1;
}

Assistant:

static int CCONV cmExecuteCommand(void* arg, const char* name, int numArgs,
                                  const char** args)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  std::vector<cmListFileArgument> lffArgs;
  lffArgs.reserve(numArgs);
  for (int i = 0; i < numArgs; ++i) {
    // Assume all arguments are quoted.
    lffArgs.emplace_back(args[i], cmListFileArgument::Quoted, 0);
  }

  cmListFileFunction lff{ name, 0, 0, std::move(lffArgs) };
  cmExecutionStatus status(*mf);
  return mf->ExecuteCommand(lff, status);
}